

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          *this)

{
  Dictionary *pDVar1;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  *this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *this_02;
  iterator __position;
  _Hash_node_base *p_Var2;
  Zp_field_operators<unsigned_int,_void> *this_03;
  pointer pvVar3;
  int iVar4;
  const_iterator cVar5;
  uint *puVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  ulong uVar10;
  pointer pPVar11;
  __hash_code __code;
  key_type *pkVar12;
  pointer pPVar13;
  uint uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer this_04;
  ulong uVar15;
  key_type kVar16;
  long lVar17;
  Element coef;
  Index i;
  int dim;
  Index pivotColumnNumber;
  ID_index pivot;
  Pos_index nullDeath;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  key_type local_d8;
  uint local_d4;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  *local_d0;
  int local_c8;
  uint local_c4;
  key_type local_c0;
  uint local_bc;
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  *local_b8;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  *local_b0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  uint *local_78;
  uint *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_bc = 0xffffffff;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,(ulong)(uint)this[1].super_type.map_._M_h._M_element_count,
               (hash<unsigned_int> *)&local_a0,(key_equal *)&local_d8,(allocator_type *)&local_c8);
  local_c8 = *(int *)&this[-1].isReduced_;
  local_d0 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_a0,(long)local_c8 + 1,(allocator_type *)&local_d8);
  pvVar3 = local_a0.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_04 = local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_04 != pvVar3; this_04 = this_04 + 1
      ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_04,(ulong)(uint)local_d0[1].super_type.map_._M_h._M_element_count);
  }
  local_d4 = 0;
  if ((int)local_d0[1].super_type.map_._M_h._M_element_count != 0) {
    this_00 = local_d0 + 1;
    do {
      lVar17 = (long)local_c8;
      local_d8 = local_d4;
      cVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_00,&local_d8);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                (lVar17 - *(int *)((long)cVar5.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x10)));
      __position._M_current = *(uint **)(this_01 + 8);
      if (__position._M_current == *(uint **)(this_01 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_01,__position,&local_d4);
      }
      else {
        *__position._M_current = local_d4;
        *(uint **)(this_01 + 8) = __position._M_current + 1;
      }
      local_d4 = local_d4 + 1;
    } while (local_d4 < (uint)local_d0[1].super_type.map_._M_h._M_element_count);
  }
  local_88 = local_a0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b0 = local_d0 + 1;
    local_a8 = &(local_d0->idToPosition_)._M_h;
    local_b8 = (vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                *)&local_d0->barcode_;
    do {
      puVar6 = ((local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_78 = ((local_a0.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      local_80 = local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (puVar6 != local_78) {
        do {
          local_d8 = *puVar6;
          local_d4 = local_d8;
          local_70 = puVar6;
          iVar7 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_b0,&local_d8);
          if (iVar7.
              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          this_02 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                     *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                              ._M_cur + 0x28);
          if (*(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                **)((long)iVar7.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                          ._M_cur + 0x28) ==
              (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
               *)0x0 || *(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          **)((long)iVar7.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                    ._M_cur + 0x28) == this_02) {
            if (local_68._M_buckets[(ulong)local_d4 % local_68._M_bucket_count] !=
                (__node_base_ptr)0x0) {
              p_Var2 = local_68._M_buckets[(ulong)local_d4 % local_68._M_bucket_count]->_M_nxt;
              uVar14 = *(uint *)&p_Var2[1]._M_nxt;
              do {
                if (local_d4 == uVar14) goto LAB_0016dfc7;
                p_Var2 = p_Var2->_M_nxt;
              } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                      (uVar14 = *(uint *)&p_Var2[1]._M_nxt,
                      (ulong)uVar14 % local_68._M_bucket_count ==
                      (ulong)local_d4 % local_68._M_bucket_count));
            }
            std::
            vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
            ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                      (local_b8,&local_d4,&local_bc,&local_c8);
          }
          else {
            local_c0 = *(key_type *)
                        (*(long *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x30) + 0x10);
            iVar8 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_a8,&local_c0);
            pkVar12 = (key_type *)
                      ((long)iVar8.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 0xc);
            if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur == (__node_type *)0x0) {
              pkVar12 = &local_c0;
            }
            local_c4 = *pkVar12;
            kVar16 = 0xffffffff;
            if (local_68._M_buckets[(ulong)local_c4 % local_68._M_bucket_count] !=
                (__node_base_ptr)0x0) {
              p_Var2 = local_68._M_buckets[(ulong)local_c4 % local_68._M_bucket_count]->_M_nxt;
              uVar14 = *(uint *)&p_Var2[1]._M_nxt;
              while (local_c4 != uVar14) {
                p_Var2 = p_Var2->_M_nxt;
                if ((p_Var2 == (_Hash_node_base *)0x0) ||
                   (uVar14 = *(uint *)&p_Var2[1]._M_nxt,
                   (ulong)uVar14 % local_68._M_bucket_count !=
                   (ulong)local_c4 % local_68._M_bucket_count)) goto LAB_0016ddc2;
              }
              kVar16 = *(key_type *)((long)&p_Var2[1]._M_nxt + 4);
            }
LAB_0016ddc2:
LAB_0016ddc6:
            if (local_c0 != 0xffffffff) {
              if (kVar16 == 0xffffffff) {
                std::
                _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<unsigned_int&,unsigned_int&>
                          ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&local_68,&local_c4,&local_d4);
                local_d8 = local_c4;
                iVar7 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                *)local_b0,&local_d8);
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  std::__throw_out_of_range("_Map_base::at");
                }
                boost::intrusive::
                list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                ::
                clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>::Delete_disposer>
                          ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                            *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                     ._M_cur + 0x28),
                           (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                            *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                     ._M_cur + 0x10));
                local_d8 = local_c8 - 1;
                std::
                vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                ::emplace_back<unsigned_int&,unsigned_int&,int>
                          (local_b8,&local_c4,&local_d4,(int *)&local_d8);
                goto LAB_0016dfc7;
              }
              local_d8 = kVar16;
              iVar9 = std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)local_b0,&local_d8);
              if (iVar9.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              uVar14 = 0;
              if (*(long *)((long)iVar9.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                  ._M_cur + 0x28) !=
                  (long)iVar9.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                        ._M_cur + 0x28 &&
                  *(long *)((long)iVar9.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                  ._M_cur + 0x28) != 0) {
                uVar14 = *(uint *)(*(long *)((long)iVar9.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                                  ._M_cur + 0x30) + -8);
              }
              this_03 = (Zp_field_operators<unsigned_int,_void> *)
                        local_d0[1].barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (this_03->characteristic_ <= uVar14) {
                uVar14 = uVar14 % this_03->characteristic_;
              }
              local_d8 = (this_03->inverse_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14];
              iVar4 = 0;
              if (*(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)this_02 != this_02 &&
                  *(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)this_02 !=
                  (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                   *)0x0) {
                iVar4 = *(int *)(*(long *)((long)iVar7.
                                                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                                 ._M_cur + 0x30) + -8);
              }
              persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                        (this_03,&local_d8,this_03->characteristic_ - iVar4);
              _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
                        (&local_d8,
                         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                          *)((long)iVar9.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                   ._M_cur + 0x10),
                         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                          *)((long)iVar7.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                   ._M_cur + 0x10));
              local_c0 = 0xffffffff;
              if (*(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)this_02 != this_02 &&
                  *(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)this_02 !=
                  (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                   *)0x0) {
                local_c0 = *(key_type *)
                            (*(long *)((long)iVar7.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                             ._M_cur + 0x30) + 0x10);
              }
              iVar8 = std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(local_a8,&local_c0);
              pkVar12 = (key_type *)
                        ((long)iVar8.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc);
              if (iVar8.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur == (__node_type *)0x0) {
                pkVar12 = &local_c0;
              }
              local_c4 = *pkVar12;
              kVar16 = 0xffffffff;
              if (local_68._M_buckets[(ulong)local_c4 % local_68._M_bucket_count] !=
                  (__node_base_ptr)0x0) {
                p_Var2 = local_68._M_buckets[(ulong)local_c4 % local_68._M_bucket_count]->_M_nxt;
                uVar14 = *(uint *)&p_Var2[1]._M_nxt;
                while (local_c4 != uVar14) {
                  p_Var2 = p_Var2->_M_nxt;
                  if ((p_Var2 == (_Hash_node_base *)0x0) ||
                     (uVar14 = *(uint *)&p_Var2[1]._M_nxt,
                     (ulong)uVar14 % local_68._M_bucket_count !=
                     (ulong)local_c4 % local_68._M_bucket_count)) goto LAB_0016ddc6;
                }
                kVar16 = *(key_type *)((long)&p_Var2[1]._M_nxt + 4);
              }
              goto LAB_0016ddc6;
            }
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
            ::
            clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>::Delete_disposer>
                      (this_02,(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                                *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x10));
            std::
            vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
            ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                      (local_b8,&local_d4,&local_bc,&local_c8);
          }
LAB_0016dfc7:
          puVar6 = local_70 + 1;
        } while (puVar6 != local_78);
      }
      local_c8 = local_c8 + -1;
      local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_80 + 1;
    } while (local_a0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_88);
  }
  pPVar11 = (local_d0->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar13 = (local_d0->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar11 != pPVar13) {
    uVar10 = ((long)pPVar13 - (long)pPVar11 >> 2) * -0x5555555555555555;
    lVar17 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar11,pPVar13,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar11,pPVar13);
    pPVar11 = (local_d0->barcode_).
              super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar13 = (local_d0->barcode_).
              super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_d8 = 0;
    if (pPVar13 != pPVar11) {
      pDVar1 = &local_d0->deathToBar_;
      uVar10 = 0;
      do {
        local_d4 = pPVar11[uVar10].death;
        if (local_d4 != 0xffffffff) {
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)pDVar1,&local_d4,&local_d8);
          uVar10 = (ulong)local_d8;
          pPVar11 = (local_d0->barcode_).
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar13 = (local_d0->barcode_).
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_d8 = (int)uVar10 + 1;
        uVar10 = (ulong)local_d8;
        uVar15 = ((long)pPVar13 - (long)pPVar11 >> 2) * -0x5555555555555555;
      } while (uVar10 <= uVar15 && uVar15 - uVar10 != 0);
    }
  }
  local_d0->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_a0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}